

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O1

ostream * operator<<(ostream *o,Person *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"name-> ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(p->name)._M_dataplus._M_p,(p->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", id-> ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(p->id)._M_dataplus._M_p,(p->id)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", address-> ",0xc);
  operator<<(poVar1,&p->address);
  return o;
}

Assistant:

ostream& operator <<(ostream& o, const Person& p) {

    o << "name-> " << p.getName() << ", id-> " << p.getId() << ", address-> " << p.getAddress();
    return o;
}